

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symul.cpp
# Opt level: O3

vector<particle,_std::allocator<particle>_> * __thiscall symul::moveParticles(symul *this)

{
  vector<std::pair<vec2<float>,int>,std::allocator<std::pair<vec2<float>,int>>> *pvVar1;
  undefined8 *puVar2;
  pointer ppVar3;
  iterator iVar4;
  pointer ppVar5;
  vec2<float> vVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  int iVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  _Result<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> *this_00;
  pointer ppVar10;
  long lVar11;
  pair<int,_int> *i_1;
  long lVar12;
  long lVar13;
  element_type *peVar14;
  pointer ppVar15;
  size_type __n;
  pointer ppVar16;
  vector<particle,_std::allocator<particle>_> *__range1;
  long lVar17;
  symul *psVar18;
  particle *i_2;
  vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_> *i;
  pointer this_01;
  ulong uVar19;
  float fVar20;
  vec2f vVar21;
  int thrn;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> collisions;
  vector<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  futures;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> bcoll;
  vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
  splited;
  int local_c0;
  float local_bc;
  __state_type local_b8;
  long local_a8;
  symul *local_a0;
  undefined1 local_98 [8];
  int local_90;
  long *local_80;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_78;
  vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
  local_60;
  __basic_future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> local_48;
  long local_38;
  
  local_c0 = 0xf;
  ppVar10 = (this->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppVar3 = (this->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::
  vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
  ::vector(&local_60,0xf,(allocator_type *)local_98);
  for (this_01 = local_60.
                 super__Vector_base<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this_01 !=
      local_60.
      super__Vector_base<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
    std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>::reserve
              (this_01,(ulong)((long)(this->particles).
                                     super__Vector_base<particle,_std::allocator<particle>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                               (long)(this->particles).
                                     super__Vector_base<particle,_std::allocator<particle>_>._M_impl
                                     .super__Vector_impl_data._M_start >> 3) / (ulong)(long)local_c0
              );
  }
  ppVar16 = (this->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar16) {
    local_bc = (float)(int)((ulong)((long)ppVar10 - (long)ppVar3 >> 4) / 0xf);
    lVar12 = 4;
    uVar19 = 0;
    do {
      fVar20 = floorf(*(float *)((long)&(ppVar16->position).x + lVar12) / local_bc);
      iVar8 = local_c0 + -1;
      if ((int)fVar20 < local_c0) {
        iVar8 = (int)fVar20;
      }
      pvVar1 = (vector<std::pair<vec2<float>,int>,std::allocator<std::pair<vec2<float>,int>>> *)
               (local_60.
                super__Vector_base<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + iVar8);
      local_98 = *(undefined1 (*) [8])((long)ppVar16 + lVar12 + -4);
      local_90 = (int)uVar19;
      iVar4._M_current = *(pair<vec2<float>,_int> **)(pvVar1 + 8);
      if (iVar4._M_current == *(pair<vec2<float>,_int> **)(pvVar1 + 0x10)) {
        std::vector<std::pair<vec2<float>,int>,std::allocator<std::pair<vec2<float>,int>>>::
        _M_realloc_insert<std::pair<vec2<float>,int>>
                  (pvVar1,iVar4,(pair<vec2<float>,_int> *)local_98);
      }
      else {
        (iVar4._M_current)->second = local_90;
        (iVar4._M_current)->first = (vec2<float>)local_98;
        *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 0xc;
      }
      uVar19 = uVar19 + 1;
      ppVar16 = (this->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar12 = lVar12 + 0x10;
    } while (uVar19 < (ulong)((long)(this->particles).
                                    super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)ppVar16 >> 4));
  }
  __n = (size_type)local_c0;
  local_a0 = this;
  if (0 < (long)__n) {
    lVar13 = 1;
    lVar12 = 0;
    iVar8 = local_c0;
    do {
      lVar11 = lVar12 + 1;
      __n = (size_type)iVar8;
      if (lVar11 < (long)__n) {
        local_bc = this->particleR + this->particleR +
                   local_60.
                   super__Vector_base<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar12].
                   super__Vector_base<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].first.y;
        lVar17 = lVar13;
        local_38 = lVar11;
        do {
          ppVar5 = local_60.
                   super__Vector_base<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar17].
                   super__Vector_base<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (ppVar15 = local_60.
                         super__Vector_base<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar17].
                         super__Vector_base<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; ppVar15 != ppVar5;
              ppVar15 = ppVar15 + 1) {
            local_98 = *(undefined1 (*) [8])&ppVar15->first;
            local_90 = ppVar15->second;
            if (local_bc < (float)local_98._4_4_) break;
            pvVar1 = (vector<std::pair<vec2<float>,int>,std::allocator<std::pair<vec2<float>,int>>>
                      *)(local_60.
                         super__Vector_base<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar12);
            iVar4._M_current = *(pair<vec2<float>,_int> **)(pvVar1 + 8);
            if (iVar4._M_current == *(pair<vec2<float>,_int> **)(pvVar1 + 0x10)) {
              std::vector<std::pair<vec2<float>,int>,std::allocator<std::pair<vec2<float>,int>>>::
              _M_realloc_insert<std::pair<vec2<float>,int>const&>
                        (pvVar1,iVar4,(pair<vec2<float>,_int> *)local_98);
            }
            else {
              vVar6 = ppVar15->first;
              (iVar4._M_current)->second = ppVar15->second;
              (iVar4._M_current)->first = vVar6;
              *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 0xc;
            }
          }
          lVar17 = lVar17 + 1;
        } while ((int)lVar17 < local_c0);
        __n = (size_type)local_c0;
        lVar11 = local_38;
        this = local_a0;
        iVar8 = local_c0;
      }
      lVar13 = lVar13 + 1;
      lVar12 = lVar11;
    } while (lVar11 < (long)__n);
  }
  std::
  vector<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ::vector((vector<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
            *)local_98,__n,(allocator_type *)&local_b8);
  if (0 < local_c0) {
    lVar13 = 8;
    lVar12 = 0;
    do {
      local_b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x68);
      p_Var9->_M_use_count = 1;
      p_Var9->_M_weak_count = 1;
      p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0016b050;
      p_Var9[1]._M_use_count = 0;
      p_Var9[1]._M_weak_count = 0;
      *(undefined4 *)&p_Var9[2]._vptr__Sp_counted_base = 0;
      *(undefined1 *)((long)&p_Var9[2]._vptr__Sp_counted_base + 4) = 0;
      p_Var9[2]._M_use_count = 0;
      p_Var9[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var9[3]._M_use_count = 0;
      p_Var9[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_0016b0a0;
      this_00 = (_Result<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> *
                )operator_new(0x30);
      std::__future_base::
      _Result<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::_Result
                (this_00);
      p_Var9[4]._vptr__Sp_counted_base = (_func_int **)this_00;
      p_Var9[4]._M_use_count = (_Atomic_word)lVar12;
      p_Var9[5]._vptr__Sp_counted_base = (_func_int **)local_a0;
      *(int **)&p_Var9[5]._M_use_count = &local_c0;
      p_Var9[6]._vptr__Sp_counted_base = (_func_int **)&local_60;
      local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_80 = (long *)operator_new(0x20);
      *local_80 = (long)&PTR___State_0016b0f8;
      local_80[1] = (long)(p_Var9 + 1);
      local_80[2] = (long)std::__future_base::
                          _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/src/symul.cpp:45:26),_int>_>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                          ::_M_run;
      local_80[3] = 0;
      std::thread::_M_start_thread(&local_78,&local_80,0);
      if (local_80 != (long *)0x0) {
        (**(code **)(*local_80 + 8))();
      }
      if (p_Var9[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
        std::terminate();
      }
      p_Var9[3]._vptr__Sp_counted_base =
           (_func_int **)
           local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)(p_Var9 + 1);
      local_b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var9;
      std::__basic_future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::__basic_future(&local_48,&local_b8);
      if (local_b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      _Var7._M_pi = local_48._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      peVar14 = local_48._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      local_48._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_48._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var9 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_98 + lVar13);
      puVar2 = (undefined8 *)((long)local_98 + -8 + lVar13);
      *puVar2 = peVar14;
      puVar2[1] = _Var7._M_pi;
      if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
      }
      if (local_48._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      psVar18 = local_a0;
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + 0x10;
    } while (lVar12 < local_c0);
    local_b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a8 = 0;
    if (0 < local_c0) {
      lVar12 = 0;
      lVar13 = 0;
      do {
        std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::get
                  (&local_78,
                   (future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                    *)((long)local_98 + lVar12));
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_b8,
                   local_b8.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi,
                   local_78.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_78.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        if (local_78.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.
                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        lVar13 = lVar13 + 1;
        lVar12 = lVar12 + 0x10;
      } while (lVar13 < local_c0);
      goto LAB_0010e120;
    }
  }
  local_a8 = 0;
  local_b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  psVar18 = local_a0;
LAB_0010e120:
  std::
  shuffle<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
            ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              )local_b8.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                       )local_b8.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi,&psVar18->mt_rand);
  _Var7._M_pi = local_b8.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  for (peVar14 = local_b8.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr; peVar14 != (element_type *)_Var7._M_pi;
      peVar14 = (element_type *)&peVar14->_M_result) {
    ppVar10 = (psVar18->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
              super__Vector_impl_data._M_start;
    particle::collideWith
              (ppVar10 + *(int *)&peVar14->_vptr__State_baseV2,
               ppVar10 + *(int *)((long)&peVar14->_vptr__State_baseV2 + 4));
  }
  ppVar10 = (psVar18->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppVar3 = (psVar18->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (ppVar10 != ppVar3) {
    do {
      particle::collideBox(ppVar10,&psVar18->box,&psVar18->particleR);
      ppVar10 = ppVar10 + 1;
    } while (ppVar10 != ppVar3);
    ppVar10 = (psVar18->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppVar3 = (psVar18->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (ppVar10 != ppVar3) {
      fVar20 = psVar18->timeTick;
      do {
        vVar21.x = (ppVar10->velocity).x * fVar20 + (ppVar10->position).x;
        vVar21.y = (ppVar10->velocity).y * fVar20 + (ppVar10->position).y;
        ppVar10->position = vVar21;
        ppVar10 = ppVar10 + 1;
      } while (ppVar10 != ppVar3);
    }
  }
  if (local_b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    operator_delete(local_b8.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,local_a8 -
                            (long)local_b8.
                                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
  }
  std::
  vector<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ::~vector((vector<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::future<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
             *)local_98);
  std::
  vector<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>,_std::allocator<std::vector<std::pair<vec2<float>,_int>,_std::allocator<std::pair<vec2<float>,_int>_>_>_>_>
  ::~vector(&local_60);
  return &psVar18->particles;
}

Assistant:

const std::vector<particle>& symul::moveParticles()
{
    using posind = std::vector<std::pair<vec2f, int>>; 

    // number of threads == number of buckets
    int thrn = 15;

    // put positions in thrn buckets by their Y
    int buckLen = particles.size() / thrn;
    std::vector<posind> splited(thrn);
    for(auto& i : splited)
        i.reserve(particles.size() * 2 / thrn);
    for(int i = 0; i < particles.size(); i++)
    {
        int mybucket = static_cast<int>(std::floor(particles[i].getPosition().getY() / buckLen));
        if(mybucket >= thrn)
            mybucket = thrn - 1;
        splited[mybucket].push_back(std::make_pair(particles[i].getPosition(), i));
    }
    // put particles close to bucket edge in multiple buckets
    for(int b = 0; b < thrn; b++)
    {
        float myend = splited[b].back().first.getY() + particleR * 2;
        for(int other = b + 1; other < thrn; other++)
        {
            for(auto p : splited[other])
            {
                if(p.first.getY() > myend)
                    break;
                splited[b].push_back(p);
            }
        }
    }

    // function that returns collisions from one bucket
    auto getCollisions = [&](int b)
    {
        std::vector<std::pair<int, int>> myCollisions;    
        myCollisions.reserve(particles.size() * 2 / thrn);

        std::sort(splited[b].begin(), splited[b].end(), [](auto x, auto y)
        { 
            return x.first.getX() < y.first.getX();
        });

        auto startj = splited[b].begin();
        for(auto i = splited[b].begin(); i < splited[b].end(); i++)
        {
            while(startj < i && startj->first.getX() < i->first.getX() - particleR * 2)
                startj++;
            for(auto j = startj; j < i; j++)
            {
                if((j->first - i->first).getLength() < 2 * particleR)
                    myCollisions.push_back(std::make_pair(i->second, j->second));
            }
        }
        return myCollisions;
    };

    // get collisions
    std::vector<std::future<std::vector<std::pair<int, int>>>> futures(thrn);
    for(int i = 0; i < thrn; i++)
    {
        futures[i] = std::async(std::launch::async, getCollisions, i);
    }

    // get collisions in one vector
    std::vector<std::pair<int, int>> collisions;
    for(int i = 0; i < thrn; i++)
    {
        auto bcoll = futures[i].get();
        collisions.insert(collisions.end(), bcoll.begin(), bcoll.end());
    }

    // shuffle collisions
    std::shuffle(collisions.begin(), collisions.end(), mt_rand);

    // apply collisions
    for(auto& i : collisions)
        particles[i.first].collideWith(particles[i.second]);
    
    // collide with box
    for(auto& i : particles)
        i.collideBox(box, particleR);

    // update position
    for(auto& p : particles)
        p.update(timeTick);

    //std::cerr << "collisions: " << collisions.size() << std::endl;

    return particles;
}